

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Npas4.cpp
# Opt level: O1

int64_t npas4::GetRAMVirtualTotal(void)

{
  sysinfo memInfo;
  sysinfo sStack_78;
  
  sysinfo(&sStack_78);
  return sStack_78.mem_unit * sStack_78.totalswap;
}

Assistant:

int64_t npas4::GetRAMVirtualTotal()
{
#ifdef WIN32
	MEMORYSTATUSEX memInfo;
	memInfo.dwLength = sizeof(MEMORYSTATUSEX);
	GlobalMemoryStatusEx(&memInfo);
	return memInfo.ullTotalPageFile;
#else
	struct sysinfo memInfo;
	sysinfo(&memInfo);
	return static_cast<int64_t>(memInfo.totalswap) * static_cast<int64_t>(memInfo.mem_unit);
#endif
}